

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O0

RPCHelpMan * wallet::getrawchangeaddress(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffffa38;
  RPCArg *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa40;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffffa48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa70;
  allocator<char> *in_stack_fffffffffffffa78;
  iterator in_stack_fffffffffffffa80;
  undefined1 *puVar2;
  RPCArgOptions *in_stack_fffffffffffffa88;
  string *in_stack_fffffffffffffa90;
  Fallback *in_stack_fffffffffffffa98;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffffaa0;
  string *in_stack_fffffffffffffaa8;
  RPCArg *in_stack_fffffffffffffab0;
  RPCResults *this_00;
  RPCResult *this_01;
  allocator<char> local_48c;
  allocator<char> local_48b;
  allocator<char> local_48a;
  allocator<char> local_489;
  pointer local_488;
  pointer examples;
  pointer results;
  undefined8 in_stack_fffffffffffffb90;
  undefined8 in_stack_fffffffffffffb98;
  undefined8 in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffba8;
  allocator<char> local_443;
  allocator<char> local_442;
  allocator<char> local_441 [31];
  allocator<char> local_422;
  allocator<char> local_421 [193];
  RPCMethodImpl *in_stack_fffffffffffffca0;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::__cxx11::string::string(in_stack_fffffffffffffa50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffa38);
  RPCArg::RPCArg(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
                 (Type)((ulong)in_stack_fffffffffffffaa0 >> 0x20),in_stack_fffffffffffffa98,
                 in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffffa98 >> 0x38);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffffa38);
  __l._M_len = (size_type)in_stack_fffffffffffffa88;
  __l._M_array = in_stack_fffffffffffffa80;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffa78,__l,
             (allocator_type *)in_stack_fffffffffffffa70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  this_01 = (RPCResult *)&stack0xfffffffffffffb9e;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  local_488 = (pointer)0x0;
  examples = (pointer)0x0;
  results = (pointer)0x0;
  this_00 = (RPCResults *)&local_488;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffa38);
  RPCResult::RPCResult
            (this_01,(Type)((ulong)this_00 >> 0x20),&in_stack_fffffffffffffab0->m_names,
             in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,(bool)skip_type_check);
  RPCResults::RPCResults(this_00,(RPCResult *)in_stack_fffffffffffffab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  HelpExampleCli(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  HelpExampleRpc(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  std::operator+(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffffa38,(string *)0x4bcc7e);
  this = (RPCArg *)&stack0xfffffffffffffb50;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::getrawchangeaddress()::__0,void>
            (in_stack_fffffffffffffa48,(anon_class_1_0_00000001 *)in_stack_fffffffffffffa40);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)in_stack_fffffffffffffba8,(string *)in_stack_fffffffffffffba0,
             (string *)in_stack_fffffffffffffb98,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffb90,
             (RPCResults *)results,(RPCExamples *)examples,in_stack_fffffffffffffca0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_48c);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_48b);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_48a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_489);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffa48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb9e);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb9f);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffa48);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_150;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_443);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_442);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_441);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_422);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_421);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan getrawchangeaddress()
{
    return RPCHelpMan{"getrawchangeaddress",
                "\nReturns a new Bitcoin address, for receiving change.\n"
                "This is for use with raw transactions, NOT normal use.\n",
                {
                    {"address_type", RPCArg::Type::STR, RPCArg::DefaultHint{"set by -changetype"}, "The address type to use. Options are \"legacy\", \"p2sh-segwit\", \"bech32\", and \"bech32m\"."},
                },
                RPCResult{
                    RPCResult::Type::STR, "address", "The address"
                },
                RPCExamples{
                    HelpExampleCli("getrawchangeaddress", "")
            + HelpExampleRpc("getrawchangeaddress", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    LOCK(pwallet->cs_wallet);

    if (!pwallet->CanGetAddresses(true)) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Error: This wallet has no available keys");
    }

    OutputType output_type = pwallet->m_default_change_type.value_or(pwallet->m_default_address_type);
    if (!request.params[0].isNull()) {
        std::optional<OutputType> parsed = ParseOutputType(request.params[0].get_str());
        if (!parsed) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("Unknown address type '%s'", request.params[0].get_str()));
        } else if (parsed.value() == OutputType::BECH32M && pwallet->GetLegacyScriptPubKeyMan()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Legacy wallets cannot provide bech32m addresses");
        }
        output_type = parsed.value();
    }

    auto op_dest = pwallet->GetNewChangeDestination(output_type);
    if (!op_dest) {
        throw JSONRPCError(RPC_WALLET_KEYPOOL_RAN_OUT, util::ErrorString(op_dest).original);
    }
    return EncodeDestination(*op_dest);
},
    };
}